

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resize_ssse3.c
# Opt level: O1

__m128i convolve8_8_odd_offset_ssse3(__m128i *s,__m128i *f)

{
  longlong in_RAX;
  longlong in_RDX;
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  __m128i alVar3;
  
  auVar1 = pmaddubsw((undefined1  [16])*s,(undefined1  [16])*f);
  auVar2 = pmaddubsw((undefined1  [16])s[1],(undefined1  [16])f[1]);
  auVar2 = paddsw(auVar2,auVar1);
  auVar1 = pmaddubsw((undefined1  [16])s[2],(undefined1  [16])f[2]);
  auVar1 = paddsw(auVar1,auVar2);
  auVar2 = pmaddubsw((undefined1  [16])s[3],(undefined1  [16])f[3]);
  auVar2 = paddsw(auVar2,auVar1);
  auVar1 = pmaddubsw((undefined1  [16])s[4],(undefined1  [16])f[4]);
  auVar2 = paddsw(auVar1,auVar2);
  auVar1 = pmaddubsw((undefined1  [16])s[2],_DAT_004d03b0);
  auVar1 = paddsw(auVar1,auVar2);
  auVar1 = paddsw(auVar1,_DAT_00515670);
  psraw(auVar1,7);
  alVar3[1] = in_RDX;
  alVar3[0] = in_RAX;
  return alVar3;
}

Assistant:

static inline __m128i convolve8_8_odd_offset_ssse3(const __m128i *const s,
                                                   const __m128i *const f) {
  // multiply 2 adjacent elements with the filter and add the result
  const __m128i k_64 = _mm_set1_epi16(1 << 6);
  const __m128i x0 = _mm_maddubs_epi16(s[0], f[0]);
  const __m128i x1 = _mm_maddubs_epi16(s[1], f[1]);
  const __m128i x2 = _mm_maddubs_epi16(s[2], f[2]);
  const __m128i x3 = _mm_maddubs_epi16(s[3], f[3]);
  const __m128i x4 = _mm_maddubs_epi16(s[4], f[4]);
  // compensate the subtracted 64 in f[2]. x5 is always non negative.
  const __m128i x5 = _mm_maddubs_epi16(s[2], _mm_set1_epi8(64));
  __m128i temp;

  // add and saturate the results together
  temp = _mm_adds_epi16(x0, x1);
  temp = _mm_adds_epi16(temp, x2);
  temp = _mm_adds_epi16(temp, x3);
  temp = _mm_adds_epi16(temp, x4);
  temp = _mm_adds_epi16(temp, x5);
  // round and shift by 7 bit each 16 bit
  temp = _mm_adds_epi16(temp, k_64);
  temp = _mm_srai_epi16(temp, 7);
  return temp;
}